

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::dht_get_mutable_item
          (session_impl *this,array<char,_32UL> key,string *salt)

{
  dht_tracker *this_00;
  string local_a0;
  function<void_(const_libtorrent::dht::item_&,_bool)> local_80;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_libtorrent::dht::item_&,_bool)>
  local_60;
  public_key local_48;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_48.bytes._M_elems[0x10] = key._M_elems[0x10];
    local_48.bytes._M_elems[0x11] = key._M_elems[0x11];
    local_48.bytes._M_elems[0x12] = key._M_elems[0x12];
    local_48.bytes._M_elems[0x13] = key._M_elems[0x13];
    local_48.bytes._M_elems[0x14] = key._M_elems[0x14];
    local_48.bytes._M_elems[0x15] = key._M_elems[0x15];
    local_48.bytes._M_elems[0x16] = key._M_elems[0x16];
    local_48.bytes._M_elems[0x17] = key._M_elems[0x17];
    local_48.bytes._M_elems[0x18] = key._M_elems[0x18];
    local_48.bytes._M_elems[0x19] = key._M_elems[0x19];
    local_48.bytes._M_elems[0x1a] = key._M_elems[0x1a];
    local_48.bytes._M_elems[0x1b] = key._M_elems[0x1b];
    local_48.bytes._M_elems[0x1c] = key._M_elems[0x1c];
    local_48.bytes._M_elems[0x1d] = key._M_elems[0x1d];
    local_48.bytes._M_elems[0x1e] = key._M_elems[0x1e];
    local_48.bytes._M_elems[0x1f] = key._M_elems[0x1f];
    local_48.bytes._M_elems[0] = key._M_elems[0];
    local_48.bytes._M_elems[1] = key._M_elems[1];
    local_48.bytes._M_elems[2] = key._M_elems[2];
    local_48.bytes._M_elems[3] = key._M_elems[3];
    local_48.bytes._M_elems[4] = key._M_elems[4];
    local_48.bytes._M_elems[5] = key._M_elems[5];
    local_48.bytes._M_elems[6] = key._M_elems[6];
    local_48.bytes._M_elems[7] = key._M_elems[7];
    local_48.bytes._M_elems[8] = key._M_elems[8];
    local_48.bytes._M_elems[9] = key._M_elems[9];
    local_48.bytes._M_elems[10] = key._M_elems[10];
    local_48.bytes._M_elems[0xb] = key._M_elems[0xb];
    local_48.bytes._M_elems[0xc] = key._M_elems[0xc];
    local_48.bytes._M_elems[0xd] = key._M_elems[0xd];
    local_48.bytes._M_elems[0xe] = key._M_elems[0xe];
    local_48.bytes._M_elems[0xf] = key._M_elems[0xf];
    local_60._M_f = (offset_in_session_impl_to_subr)get_mutable_callback;
    local_60._8_8_ = 0;
    local_60._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          )(_Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>
            )this;
    ::std::function<void(libtorrent::dht::item_const&,bool)>::
    function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::dht::item_const&,bool)>,void>
              ((function<void(libtorrent::dht::item_const&,bool)> *)&local_80,&local_60);
    ::std::__cxx11::string::string((string *)&local_a0,(string *)salt);
    libtorrent::dht::dht_tracker::get_item(this_00,&local_48,&local_80,&local_a0);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::_Function_base::~_Function_base(&local_80.super__Function_base);
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}